

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O2

void __thiscall ProxyClient::~ProxyClient(ProxyClient *this)

{
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  free(this->m_sendBuffer);
  local_18 = 0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  stop(this,(function<void_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  clear(this);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ProxyClient::SessionData>,_std::allocator<std::pair<const_unsigned_int,_ProxyClient::SessionData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_sessionDataMap)._M_h);
  net_uv::UVTimer::~UVTimer(&this->m_update);
  net_uv::UVLoop::~UVLoop(&this->m_loop);
  std::_Function_base::~_Function_base(&(this->m_stopCall).super__Function_base);
  std::__cxx11::string::~string((string *)&this->m_password);
  std::__cxx11::string::~string((string *)&this->m_username);
  std::__cxx11::string::~string((string *)&this->m_remoteIP);
  std::unique_ptr<Cypher,_std::default_delete<Cypher>_>::~unique_ptr(&this->m_cypher);
  std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::~unique_ptr(&this->m_pipe);
  std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::~unique_ptr
            (&this->m_tcpSvr);
  return;
}

Assistant:

ProxyClient::~ProxyClient()
{
	fc_free(m_sendBuffer);
	stop(NULL);
	clear();
}